

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gop_structure.c
# Opt level: O2

void set_params_for_internal_arfs
               (TWO_PASS *twopass,TWO_PASS_FRAME *twopass_frame,PRIMARY_RATE_CONTROL *p_rc,
               FRAME_INFO *frame_info,GF_GROUP *gf_group,int *cur_frame_idx,int *frame_ind,
               int *parallel_frame_count,int max_parallel_frames,int do_frame_parallel_encode,
               int *first_frame_index,int depth_thr,int *cur_disp_idx,int layer_depth,
               int arf_src_offset,int offset,int f_frames,int b_frames)

{
  int iVar1;
  long lVar2;
  
  gf_group->update_type[*frame_ind] = '\x06';
  gf_group->arf_src_offset[*frame_ind] = (uchar)arf_src_offset;
  gf_group->cur_frame_idx[*frame_ind] = (uchar)*cur_frame_idx;
  gf_group->layer_depth[*frame_ind] = layer_depth;
  gf_group->frame_type[*frame_ind] = '\x01';
  gf_group->refbuf_state[*frame_ind] = '\x01';
  gf_group->display_idx[*frame_ind] = (uint)gf_group->arf_src_offset[*frame_ind] + *cur_disp_idx;
  iVar1 = av1_calc_arf_boost(twopass,twopass_frame,p_rc,frame_info,offset,f_frames,b_frames,
                             (int *)0x0,(int *)0x0,0);
  gf_group->arf_boost[*frame_ind] = iVar1;
  if (do_frame_parallel_encode != 0) {
    if (depth_thr != 0x7fffffff) {
      lVar2 = (long)*frame_ind;
      if (gf_group->layer_depth[lVar2 + -1] == layer_depth) {
        gf_group->frame_parallel_level[lVar2] = 2;
        gf_group->skip_frame_refresh[*frame_ind][0] = gf_group->display_idx[(long)*frame_ind + -1];
        gf_group->skip_frame_refresh[*frame_ind][1] = gf_group->display_idx[(long)*frame_ind + -2];
        gf_group->skip_frame_as_ref[*frame_ind] = gf_group->display_idx[(long)*frame_ind + -1];
      }
      else {
        gf_group->frame_parallel_level[lVar2] = 1;
      }
    }
    if (*parallel_frame_count <= max_parallel_frames && 1 < *parallel_frame_count) {
      if (gf_group->arf_src_offset[*frame_ind] < 7) {
        gf_group->frame_parallel_level[*frame_ind] = 2;
      }
      *parallel_frame_count = 1;
    }
  }
  set_src_offset(gf_group,first_frame_index,*cur_frame_idx,*frame_ind);
  *frame_ind = *frame_ind + 1;
  return;
}

Assistant:

static inline void set_params_for_internal_arfs(
    const TWO_PASS *twopass, const TWO_PASS_FRAME *twopass_frame,
    const PRIMARY_RATE_CONTROL *p_rc, FRAME_INFO *frame_info,
    GF_GROUP *const gf_group, int *cur_frame_idx, int *frame_ind,
    int *parallel_frame_count, int max_parallel_frames,
    int do_frame_parallel_encode, int *first_frame_index, int depth_thr,
    int *cur_disp_idx, int layer_depth, int arf_src_offset, int offset,
    int f_frames, int b_frames) {
  gf_group->update_type[*frame_ind] = INTNL_ARF_UPDATE;
  gf_group->arf_src_offset[*frame_ind] = arf_src_offset;
  gf_group->cur_frame_idx[*frame_ind] = *cur_frame_idx;
  gf_group->layer_depth[*frame_ind] = layer_depth;
  gf_group->frame_type[*frame_ind] = INTER_FRAME;
  gf_group->refbuf_state[*frame_ind] = REFBUF_UPDATE;
  gf_group->display_idx[*frame_ind] =
      (*cur_disp_idx) + gf_group->arf_src_offset[*frame_ind];
  gf_group->arf_boost[*frame_ind] =
      av1_calc_arf_boost(twopass, twopass_frame, p_rc, frame_info, offset,
                         f_frames, b_frames, NULL, NULL, 0);

  if (do_frame_parallel_encode) {
    if (depth_thr != INT_MAX) {
      assert(depth_thr == 3 || depth_thr == 4);
      assert(IMPLIES(depth_thr == 3, layer_depth == 4));
      assert(IMPLIES(depth_thr == 4, layer_depth == 5));
      // Set frame_parallel_level of the first frame in the given layer to 1.
      if (gf_group->layer_depth[(*frame_ind) - 1] != layer_depth) {
        gf_group->frame_parallel_level[*frame_ind] = 1;
      } else {
        // Set frame_parallel_level of the consecutive frame in the same given
        // layer to 2.
        assert(gf_group->frame_parallel_level[(*frame_ind) - 1] == 1);
        gf_group->frame_parallel_level[*frame_ind] = 2;
        // Store the display order hints of the past 2 INTNL_ARF_UPDATE
        // frames which would not have been displayed at the time of the encode
        // of current frame.
        gf_group->skip_frame_refresh[*frame_ind][0] =
            gf_group->display_idx[(*frame_ind) - 1];
        gf_group->skip_frame_refresh[*frame_ind][1] =
            gf_group->display_idx[(*frame_ind) - 2];
        // Set the display_idx of frame_parallel_level 1 frame in
        // gf_group->skip_frame_as_ref.
        gf_group->skip_frame_as_ref[*frame_ind] =
            gf_group->display_idx[(*frame_ind) - 1];
      }
    }
    // If max_parallel_frames is not exceeded and if the frame will not be
    // temporally filtered, encode the next internal ARF frame in parallel.
    if (*parallel_frame_count > 1 &&
        *parallel_frame_count <= max_parallel_frames) {
      if (gf_group->arf_src_offset[*frame_ind] < TF_LOOKAHEAD_IDX_THR)
        gf_group->frame_parallel_level[*frame_ind] = 2;
      *parallel_frame_count = 1;
    }
  }
  set_src_offset(gf_group, first_frame_index, *cur_frame_idx, *frame_ind);
  ++(*frame_ind);
}